

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_SmoothStep_Test::TestBody(Sampling_SmoothStep_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  undefined1 auVar8 [16];
  float *pfVar9;
  int iVar10;
  Allocator AVar11;
  char *pcVar12;
  char *in_R9;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Float FVar15;
  float u;
  float fVar16;
  Float FVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar18 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar19 [16];
  float n2;
  undefined1 auVar20 [16];
  span<const_float> f;
  AssertHelper local_158;
  float local_14c;
  Uniform1DIter __begin1;
  AssertionResult gtest_ar_4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Float dp;
  AssertHelper local_f8;
  AssertionResult gtest_ar_;
  Uniform1DIter __end1;
  PiecewiseConstant1D distrib;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  FVar15 = pbrt::SampleSmoothStep(0.0,10.0,20.0);
  values.alloc.memoryResource = (memory_resource *)0x3fb999999999999a;
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)(FVar15 + -10.0)),auVar13);
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
  super_IndexingIterator<pbrt::detail::Uniform1DIter>.i = auVar13._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&distrib,"std::abs(start - 10)",".1",(float *)&__begin1,(double *)&values);
  if ((char)distrib.func.alloc.memoryResource == '\0') {
    testing::Message::Message((Message *)&values);
    std::ostream::operator<<(values.alloc.memoryResource + 2,FVar15);
    if (distrib.func.ptr == (float *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)distrib.func.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__begin1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x261,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&values);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&distrib.func.ptr);
  FVar15 = pbrt::SampleSmoothStep(1.0,-10.0,-5.0);
  values.alloc.memoryResource = (memory_resource *)0x3ee4f8b588e368f1;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)(FVar15 + 5.0)),auVar2);
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
  super_IndexingIterator<pbrt::detail::Uniform1DIter>.i = auVar13._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&distrib,"std::abs(end - -5)","1e-5",(float *)&__begin1,(double *)&values);
  if ((char)distrib.func.alloc.memoryResource == '\0') {
    testing::Message::Message((Message *)&values);
    std::ostream::operator<<(values.alloc.memoryResource + 2,FVar15);
    if (distrib.func.ptr == (float *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)distrib.func.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__begin1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x264,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&values);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&distrib.func.ptr);
  FVar15 = pbrt::SampleSmoothStep(0.5,0.0,1.0);
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
  super_IndexingIterator<pbrt::detail::Uniform1DIter>.i = -0x771c970f;
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
  super_IndexingIterator<pbrt::detail::Uniform1DIter>.n = 0x3ee4f8b5;
  auVar3._8_4_ = 0xffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (double)FVar15 + -0.733615;
  auVar13 = vandpd_avx512vl(auVar18,auVar3);
  values.alloc.memoryResource = (memory_resource *)vmovlpd_avx(auVar13);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)&distrib,"std::abs(mid - 0.733615)","1e-5",(double *)&values,
             (double *)&__begin1);
  if ((char)distrib.func.alloc.memoryResource == '\0') {
    testing::Message::Message((Message *)&values);
    std::ostream::operator<<(values.alloc.memoryResource + 2,FVar15);
    if (distrib.func.ptr == (float *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)distrib.func.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__begin1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x268,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&values);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&distrib.func.ptr);
  values.alloc.memoryResource._0_4_ = 1000;
  values.ptr = (float *)0x0;
  values.nAlloc = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__begin1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&values);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&values);
  iVar10 = __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
  while (iVar10 != __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
                   super_IndexingIterator<pbrt::detail::Uniform1DIter>.i) {
    u = pbrt::RNG::Uniform<float>(&__begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
    FVar15 = pbrt::SampleSmoothStep(u,-3.0,5.0);
    local_14c = (FVar15 + 3.0) * 0.125;
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_14c));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)local_14c),ZEXT816(0) << 0x40,1);
    fVar16 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar13._0_4_);
    auVar14._4_12_ = auVar13._4_12_;
    auVar14._0_4_ = fVar16;
    auVar13 = vfmadd132ss_fma(auVar14,SUB6416(ZEXT464(0x40400000),0),ZEXT416(0xc0000000));
    FVar15 = pbrt::SmoothStepPDF(FVar15,-3.0,5.0);
    gtest_ar_.success_ = true;
    gtest_ar_._1_7_ = 0x3ee4f8b588e368;
    fVar16 = (fVar16 * fVar16 * auVar13._0_4_) / FVar15;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(fVar16 + -4.0)),auVar4);
    gtest_ar_4._0_4_ = auVar13._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&distrib,"std::abs(ratio - 4)","1e-5",(float *)&gtest_ar_4,
               (double *)&gtest_ar_);
    if ((char)distrib.func.alloc.memoryResource == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),fVar16);
      pcVar12 = "";
      if (distrib.func.ptr != (float *)0x0) {
        pcVar12 = *(char **)distrib.func.ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x26e,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&distrib.func.ptr);
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar8._4_4_ = extraout_XMM0_Db;
    auVar8._0_4_ = u;
    auVar8._8_4_ = extraout_XMM0_Dc;
    auVar8._12_4_ = extraout_XMM0_Dd;
    fVar16 = local_14c * local_14c;
    auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),ZEXT416((uint)(local_14c * fVar16)),
                             ZEXT416(0x40000000));
    auVar13 = vandps_avx(auVar8,auVar20);
    fVar16 = auVar2._0_4_ - auVar2._0_4_;
    auVar19._0_4_ = fVar16 / fVar16;
    auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar2 = vandps_avx(auVar19,auVar20);
    auVar13 = vminss_avx(auVar2,auVar13);
    fVar16 = u - auVar19._0_4_;
    bVar7 = auVar13._0_4_ < 0.01;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auVar13 = vandps_avx(ZEXT416((uint)bVar7 * (int)fVar16 +
                                 (uint)!bVar7 * (int)((fVar16 + fVar16) / (u + auVar19._0_4_))),
                         auVar20);
    gtest_ar_.success_ = auVar13._0_4_ <= 0.01;
    if (0.01 < auVar13._0_4_) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&distrib,(internal *)&gtest_ar_,
                 (AssertionResult *)"checkErr(u, InvertSmoothStepSample(x, -3, 5))","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x278,(char *)CONCAT71(distrib.func.alloc.memoryResource._1_7_,
                                         (char)distrib.func.alloc.memoryResource));
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&distrib);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    iVar10 = __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
             super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1;
    __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
    super_IndexingIterator<pbrt::detail::Uniform1DIter>.i = iVar10;
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:635:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:635:15)>
             ::_M_manager;
  AVar11.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Sample1DFunction(&values,(function<float_(float)> *)&local_58,0x400,0x10000,0.0,1.0,AVar11);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  pfVar9 = values.ptr;
  AVar11.memoryResource = pstd::pmr::new_delete_resource();
  f.n = values.nStored;
  f.ptr = pfVar9;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,AVar11);
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
  super_IndexingIterator<pbrt::detail::Uniform1DIter>.i = 100;
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng.state = 0xf38f;
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng.inc = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__end1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&__begin1);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((Uniform1DIter *)&gtest_ar_,
             (IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&__begin1);
  for (; __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i != gtest_ar_._0_4_;
      __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
      super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
           __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
    local_14c = pbrt::RNG::Uniform<float>
                          (&__end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
    FVar15 = pbrt::SampleSmoothStep(local_14c,0.0,1.0);
    FVar17 = pbrt::SmoothStepPDF(FVar15,0.0,1.0);
    local_14c = pbrt::PiecewiseConstant1D::Sample(&distrib,local_14c,&dp,(int *)0x0);
    local_158.data_ = (AssertHelperData *)0x3f689374bc6a7efa;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(FVar15 - local_14c)),auVar5);
    local_f8.data_._0_4_ = auVar13._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar_4,"std::abs(cx - dx)","3e-3",(float *)&local_f8,
               (double *)&local_158);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&local_158);
      std::operator<<((ostream *)&(local_158.data_)->line,"Closed form = ");
      std::ostream::operator<<(&(local_158.data_)->line,FVar15);
      std::operator<<((ostream *)&(local_158.data_)->line,", distrib = ");
      std::ostream::operator<<(&(local_158.data_)->line,local_14c);
      pcVar12 = "";
      if (gtest_ar_4.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x284,pcVar12);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_158);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    local_158.data_ = (AssertHelperData *)0x3f689374bc6a7efa;
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(FVar17 - dp)),auVar6);
    local_f8.data_._0_4_ = auVar13._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar_4,"std::abs(cp - dp)","3e-3",(float *)&local_f8,
               (double *)&local_158);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&local_158);
      std::operator<<((ostream *)&(local_158.data_)->line,"Closed form PDF = ");
      std::ostream::operator<<(&(local_158.data_)->line,FVar17);
      std::operator<<((ostream *)&(local_158.data_)->line,", distrib PDF = ");
      std::ostream::operator<<(&(local_158.data_)->line,dp);
      pcVar12 = "";
      if (gtest_ar_4.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x286,pcVar12);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_158);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
  }
  pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(&distrib);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&values);
  return;
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}